

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmBrReg1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1,int C1)

{
  Data *this_00;
  bool bVar1;
  undefined4 local_34;
  undefined2 local_30;
  undefined1 auStack_2e [2];
  OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_0159efbd == '\0') && (local_30 = (undefined2)R1, R1 < 0x10000)) {
    local_34 = 10;
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    _auStack_2e = C1;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,&local_34,10);
    AddJumpOffset(this,EndOfBlock,labelID,10);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg1Const1(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1, int C1)
    {
        OpLayoutT_BrInt1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1) && SizePolicy::Assign(layout.C1, C1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt1Const1<SizePolicy>) - offsetof(OpLayoutT_BrInt1Const1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }